

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

ALLEGRO_BITMAP * ObtainBitmap(char *name)

{
  char *__s1;
  int iVar1;
  DATA_ENTRY *pDVar2;
  
  pDVar2 = demo_data;
  while( true ) {
    if (pDVar2 == (DATA_ENTRY *)0x0) {
      return (ALLEGRO_BITMAP *)0x0;
    }
    __s1 = pDVar2->name;
    if (__s1 == (char *)0x0) break;
    iVar1 = strcmp(pDVar2->type,"bitmap");
    if ((iVar1 == 0) && (iVar1 = strcmp(__s1,name), iVar1 == 0)) {
      return (ALLEGRO_BITMAP *)pDVar2->dat;
    }
    pDVar2 = pDVar2 + 1;
  }
  return (ALLEGRO_BITMAP *)0x0;
}

Assistant:

ALLEGRO_BITMAP *ObtainBitmap(const char *name)
{
   DATA_ENTRY *data = demo_data;
   while (data && data->name) {
      if (!strcmp(data->type, "bitmap") &&
         !strcmp(data->name, name)) return data->dat;
      data++;
   }
   return NULL;
}